

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.h
# Opt level: O3

NodeRefPtr<4> __thiscall
embree::sse2::BVHBuilderBinnedFastSpatialSAH::
CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleMi<4>>>::
operator()(CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleMi<4>>>
           *this,PrimRef *prims,range<unsigned_long> *range,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  float fVar3;
  float fVar4;
  ThreadLocal2 *this_00;
  iterator __position;
  long lVar5;
  long lVar6;
  undefined8 *puVar7;
  undefined4 uVar8;
  __pointer_type pFVar9;
  undefined8 *puVar10;
  ThreadLocal *pTVar11;
  ulong uVar12;
  char *pcVar13;
  undefined1 *puVar14;
  size_t sVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  PrimRef *pPVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  vuint<4> v1;
  vuint<4> geomID;
  vuint<4> v2;
  undefined8 *local_b8;
  undefined8 uStack_b0;
  __pointer_type local_a0;
  ThreadLocal2 *local_98;
  undefined8 uStack_90;
  undefined8 *local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleMi<4>>>
  *local_78;
  ThreadLocal *local_70;
  ThreadLocal2 *local_68;
  undefined8 uStack_60;
  ulong local_50;
  float local_48 [6];
  
  uVar18 = range->_begin;
  uVar24 = range->_end;
  if (uVar18 < uVar24) {
    puVar14 = (undefined1 *)((long)&prims[uVar18].lower.field_0 + 0xc);
    do {
      puVar14[3] = puVar14[3] & 7;
      uVar18 = uVar18 + 1;
      uVar24 = range->_end;
      puVar14 = puVar14 + 0x20;
    } while (uVar18 < uVar24);
    uVar18 = range->_begin;
  }
  uVar24 = (uVar24 - uVar18) + 3;
  local_50 = uVar24 >> 2;
  local_88 = (undefined8 *)(local_50 * 0x50);
  local_70 = alloc.talloc1;
  this_00 = (alloc.talloc1)->parent;
  local_a0 = alloc.alloc;
  local_78 = this;
  if (alloc.alloc != (this_00->alloc)._M_b._M_p) {
    uStack_90 = CONCAT71(uStack_90._1_7_,1);
    local_98 = this_00;
    MutexSys::lock(&this_00->mutex);
    pFVar9 = local_a0;
    if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_00->alloc0).end + (this_00->alloc1).end) -
           ((this_00->alloc0).cur + (this_00->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_00->alloc0).bytesUsed = 0;
    (this_00->alloc0).bytesWasted = 0;
    (this_00->alloc0).end = 0;
    (this_00->alloc0).allocBlockSize = 0;
    (this_00->alloc0).ptr = (char *)0x0;
    (this_00->alloc0).cur = 0;
    if (local_a0 == (__pointer_type)0x0) {
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
    }
    else {
      (this_00->alloc0).allocBlockSize = local_a0->defaultBlockSize;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).allocBlockSize = local_a0->defaultBlockSize;
    }
    LOCK();
    (this_00->alloc)._M_b._M_p = local_a0;
    UNLOCK();
    local_b8 = &FastAllocator::s_thread_local_allocators_lock;
    uStack_b0 = CONCAT71(uStack_b0._1_7_,1);
    local_68 = this_00;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (pFVar9->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pFVar9->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&pFVar9->thread_local_allocators,__position,&local_68);
    }
    else {
      *__position._M_current = this_00;
      pppTVar2 = &(pFVar9->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if ((char)uStack_90 == '\x01') {
      MutexSys::unlock(&local_98->mutex);
    }
  }
  pTVar11 = local_70;
  puVar10 = local_88;
  local_70->bytesUsed = local_70->bytesUsed + (long)local_88;
  sVar15 = local_70->cur;
  uVar16 = (ulong)(-(int)sVar15 & 0xf);
  uVar12 = (long)local_88 + uVar16 + sVar15;
  local_70->cur = uVar12;
  if (local_70->end < uVar12) {
    local_70->cur = sVar15;
    puVar7 = (undefined8 *)local_70->allocBlockSize;
    if ((undefined8 *)((long)local_88 * 4) < puVar7 || (long)local_88 * 4 - (long)puVar7 == 0) {
      local_b8 = puVar7;
      pcVar13 = (char *)FastAllocator::malloc(local_a0,(size_t)&local_b8);
      pTVar11->ptr = pcVar13;
      sVar15 = (pTVar11->end - pTVar11->cur) + pTVar11->bytesWasted;
      pTVar11->bytesWasted = sVar15;
      pTVar11->end = (size_t)local_b8;
      pTVar11->cur = (size_t)puVar10;
      if (local_b8 < puVar10) {
        pTVar11->cur = 0;
        local_b8 = (undefined8 *)pTVar11->allocBlockSize;
        pcVar13 = (char *)FastAllocator::malloc(local_a0,(size_t)&local_b8);
        pTVar11->ptr = pcVar13;
        sVar15 = (pTVar11->end - pTVar11->cur) + pTVar11->bytesWasted;
        pTVar11->bytesWasted = sVar15;
        pTVar11->end = (size_t)local_b8;
        pTVar11->cur = (size_t)puVar10;
        if (local_b8 < puVar10) {
          local_70->cur = 0;
          pcVar13 = (char *)0x0;
        }
        else {
          local_70->bytesWasted = sVar15;
        }
      }
      else {
        pTVar11->bytesWasted = sVar15;
      }
    }
    else {
      pcVar13 = (char *)FastAllocator::malloc(local_a0,(size_t)&local_88);
    }
  }
  else {
    local_70->bytesWasted = local_70->bytesWasted + uVar16;
    pcVar13 = local_70->ptr + (uVar12 - (long)local_88);
  }
  if (3 < uVar24) {
    lVar17 = 0;
    do {
      uVar24 = range->_end;
      lVar19 = *(long *)(*(long *)local_78 + 0x68);
      local_b8 = (undefined8 *)0x0;
      uStack_b0 = 0;
      local_98 = (ThreadLocal2 *)0x0;
      uStack_90 = 0;
      local_68 = (ThreadLocal2 *)0x0;
      uStack_60 = 0;
      local_88 = (undefined8 *)0xffffffffffffffff;
      uStack_80 = 0xffffffff;
      uStack_7c = 0xffffffff;
      local_48[0] = -NAN;
      local_48[1] = -NAN;
      local_48[2] = -NAN;
      local_48[3] = -NAN;
      pPVar20 = prims + uVar18;
      lVar21 = 0;
      do {
        if (uVar18 < uVar24) {
          fVar3 = (pPVar20->lower).field_0.m128[3];
          *(float *)((long)&local_88 + lVar21) = fVar3;
          fVar4 = (pPVar20->upper).field_0.m128[3];
          *(float *)((long)local_48 + lVar21) = fVar4;
          lVar5 = *(long *)(*(long *)(lVar19 + 0x1e8) + (ulong)(uint)fVar3 * 8);
          lVar6 = *(long *)(lVar5 + 0x58);
          lVar23 = (ulong)(uint)fVar4 * *(long *)(lVar5 + 0x68);
          uVar22 = *(uint *)(lVar5 + 0xa0) >> 2;
          *(uint *)((long)&local_b8 + lVar21) = *(int *)(lVar6 + lVar23) * uVar22;
          *(uint *)((long)&local_98 + lVar21) = *(int *)(lVar6 + 4 + lVar23) * uVar22;
          *(uint *)((long)&local_68 + lVar21) = uVar22 * *(int *)(lVar6 + 8 + lVar23);
          uVar18 = uVar18 + 1;
        }
        else if (lVar21 != 0) {
          *(undefined4 *)((long)&local_88 + lVar21) = local_88._0_4_;
          *(undefined4 *)((long)local_48 + lVar21) = 0xffffffff;
          uVar8 = local_b8._0_4_;
          *(undefined4 *)((long)&local_b8 + lVar21) = local_b8._0_4_;
          *(undefined4 *)((long)&local_98 + lVar21) = uVar8;
          *(undefined4 *)((long)&local_68 + lVar21) = uVar8;
        }
        if (uVar18 < uVar24) {
          pPVar20 = prims + uVar18;
        }
        lVar21 = lVar21 + 4;
      } while (lVar21 != 0x10);
      lVar19 = lVar17 * 0x50;
      *(undefined8 **)(pcVar13 + lVar19) = local_b8;
      *(undefined8 *)(pcVar13 + lVar19 + 8) = uStack_b0;
      *(ThreadLocal2 **)(pcVar13 + lVar19 + 0x10) = local_98;
      *(undefined8 *)(pcVar13 + lVar19 + 0x10 + 8) = uStack_90;
      *(ThreadLocal2 **)(pcVar13 + lVar19 + 0x20) = local_68;
      *(undefined8 *)(pcVar13 + lVar19 + 0x20 + 8) = uStack_60;
      *(undefined8 **)(pcVar13 + lVar19 + 0x30) = local_88;
      *(ulong *)(pcVar13 + lVar19 + 0x30 + 8) = CONCAT44(uStack_7c,uStack_80);
      *(ulong *)(pcVar13 + lVar19 + 0x40) = CONCAT44(local_48[1],local_48[0]);
      *(ulong *)(pcVar13 + lVar19 + 0x40 + 8) = CONCAT44(local_48[3],local_48[2]);
      lVar17 = lVar17 + 1;
    } while (lVar17 != local_50 + (local_50 == 0));
  }
  uVar18 = 7;
  if (local_50 < 7) {
    uVar18 = local_50;
  }
  return (NodeRefPtr<4>)(uVar18 | (ulong)pcVar13 | 8);
}

Assistant:

__noinline ReductionTy operator() (PrimRef* prims, const range<size_t>& range, Allocator alloc) const
        {
          for (size_t i=range.begin(); i<range.end(); i++)
            prims[i].lower.u &= GEOMID_MASK;

          return userCreateLeaf(prims,range,alloc);
        }